

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

pointer __thiscall
slang::SmallVectorBase<slang::ast::NetAlias>::emplaceRealloc<slang::ast::NetAlias>
          (SmallVectorBase<slang::ast::NetAlias> *this,pointer pos,NetAlias *args)

{
  undefined8 *puVar1;
  unsigned_long *puVar2;
  undefined8 *puVar3;
  ulong uVar4;
  pointer p;
  ValueSymbol *pVVar5;
  Expression *pEVar6;
  unsigned_long uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  pointer pNVar11;
  pointer pNVar12;
  pointer pNVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  
  if (this->len == 0x3ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar16 = this->len + 1;
  uVar4 = this->cap;
  if (uVar16 < uVar4 * 2) {
    uVar16 = uVar4 * 2;
  }
  if (0x3ffffffffffffff - uVar4 < uVar4) {
    uVar16 = 0x3ffffffffffffff;
  }
  lVar17 = (long)pos - (long)this->data_;
  pNVar13 = (pointer)operator_new(uVar16 << 5);
  pVVar5 = (args->sym).ptr;
  pEVar6 = (args->expr).ptr;
  uVar7 = (args->bounds).second;
  puVar2 = (unsigned_long *)((long)pNVar13 + lVar17 + 0x10);
  *puVar2 = (args->bounds).first;
  puVar2[1] = uVar7;
  *(undefined8 *)((long)pNVar13 + lVar17) = pVVar5;
  ((undefined8 *)((long)pNVar13 + lVar17))[1] = pEVar6;
  p = this->data_;
  lVar14 = this->len * 0x20;
  lVar15 = (long)p + (lVar14 - (long)pos);
  pNVar11 = p;
  pNVar12 = pNVar13;
  if (lVar15 == 0) {
    if (this->len != 0) {
      lVar15 = 0;
      do {
        puVar1 = (undefined8 *)((long)&(p->sym).ptr + lVar15);
        uVar8 = *puVar1;
        uVar9 = puVar1[1];
        puVar1 = (undefined8 *)((long)&(p->bounds).first + lVar15);
        uVar10 = puVar1[1];
        puVar3 = (undefined8 *)((long)&(pNVar13->bounds).first + lVar15);
        *puVar3 = *puVar1;
        puVar3[1] = uVar10;
        puVar1 = (undefined8 *)((long)&(pNVar13->sym).ptr + lVar15);
        *puVar1 = uVar8;
        puVar1[1] = uVar9;
        lVar15 = lVar15 + 0x20;
      } while (lVar14 != lVar15);
    }
  }
  else {
    for (; pNVar11 != pos; pNVar11 = pNVar11 + 1) {
      pVVar5 = (pNVar11->sym).ptr;
      pEVar6 = (pNVar11->expr).ptr;
      uVar7 = (pNVar11->bounds).second;
      (pNVar12->bounds).first = (pNVar11->bounds).first;
      (pNVar12->bounds).second = uVar7;
      (pNVar12->sym).ptr = pVVar5;
      (pNVar12->expr).ptr = pEVar6;
      pNVar12 = pNVar12 + 1;
    }
    memcpy((void *)((long)pNVar13 + lVar17 + 0x20),pos,(lVar15 - 0x20U & 0xffffffffffffffe0) + 0x20)
    ;
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
  }
  this->len = this->len + 1;
  this->cap = uVar16;
  this->data_ = pNVar13;
  return (pointer)((long)pNVar13 + lVar17);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}